

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sharedobject.h
# Opt level: O2

CollationSettings *
icu_63::SharedObject::copyOnWrite<icu_63::CollationSettings>(CollationSettings **ptr)

{
  int32_t iVar1;
  CollationSettings *this;
  CollationSettings *other;
  size_t in_RSI;
  
  other = *ptr;
  iVar1 = getRefCount(&other->super_SharedObject);
  if (1 < iVar1) {
    this = (CollationSettings *)UMemory::operator_new((UMemory *)0x358,in_RSI);
    if (this == (CollationSettings *)0x0) {
      other = (CollationSettings *)0x0;
    }
    else {
      CollationSettings::CollationSettings(this,other);
      removeRef(&other->super_SharedObject);
      *ptr = this;
      addRef((SharedObject *)this);
      other = this;
    }
  }
  return other;
}

Assistant:

static T *copyOnWrite(const T *&ptr) {
        const T *p = ptr;
        if(p->getRefCount() <= 1) { return const_cast<T *>(p); }
        T *p2 = new T(*p);
        if(p2 == NULL) { return NULL; }
        p->removeRef();
        ptr = p2;
        p2->addRef();
        return p2;
    }